

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O3

int __thiscall JetHead::CircularBuffer::peekLine(CircularBuffer *this,string *line,char *terminal)

{
  byte *pbVar1;
  size_t sVar2;
  int iVar3;
  byte *pbVar4;
  AutoLock lock;
  AutoLock local_40;
  
  AutoLock::AutoLock(&local_40,&this->mLock);
  sVar2 = strlen(terminal);
  if (this->mLen != 0) {
    pbVar1 = this->mReadPtr;
    iVar3 = 0;
    pbVar4 = pbVar1;
    do {
      if ((uint)*pbVar4 == (int)terminal[iVar3]) {
        iVar3 = iVar3 + 1;
      }
      else {
        iVar3 = 0;
      }
      pbVar4 = pbVar4 + 1;
      if (iVar3 == (int)sVar2) {
        if (pbVar4 < pbVar1) {
          std::__cxx11::string::_M_replace
                    ((ulong)line,0,(char *)line->_M_string_length,(ulong)pbVar1);
          std::__cxx11::string::append((char *)line,(ulong)this->mBuffer);
        }
        else {
          std::__cxx11::string::_M_replace
                    ((ulong)line,0,(char *)line->_M_string_length,(ulong)pbVar1);
        }
        iVar3 = (int)line->_M_string_length + (int)sVar2;
        goto LAB_00115d5f;
      }
      if (pbVar4 == this->mEnd) {
        pbVar4 = this->mBuffer;
      }
    } while (pbVar4 != this->mWritePtr);
  }
  iVar3 = 0;
LAB_00115d5f:
  AutoLock::~AutoLock(&local_40);
  return iVar3;
}

Assistant:

int CircularBuffer::peekLine( JHSTD::string &line, const char *terminal )
{
	AutoLock lock( mLock );
	int term_len = strlen( terminal );
	int state = 0;
	uint8_t *ptr = mReadPtr;
	bool found = false;
	
	if ( mLen == 0 ) 
		return 0;
	
	do {
		if ( *ptr == terminal[ state ] )
			state += 1;
		else
			state = 0;
	
		if ( state == term_len )
		{
			found = true;
			break;
		}
		
		ptr += 1;
		if ( ptr == mEnd )
			ptr = mBuffer;
	} while( ptr != mWritePtr );
	
	if ( found )
	{
		// move passed the terminals last char, don't care about wrapping here.
		ptr += 1;

		// if wrap
		if ( ptr < mReadPtr )
		{
			line.assign( (char*)mReadPtr, mEnd - mReadPtr );
			line.append( (char*)mBuffer, ptr - mBuffer - term_len );
		}
		else
			line.assign( (char*)mReadPtr, ptr - mReadPtr - term_len );

		return line.length() + term_len;
	}

	return 0;
}